

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O0

void __thiscall
RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
::pop_front(RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
            *this)

{
  bool bVar1;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RDI;
  
  bVar1 = empty(in_RDI);
  if (!bVar1) {
    in_RDI->begin_ = in_RDI->begin_ + 1;
    in_RDI->size_ = in_RDI->size_ - 1;
    if ((long)in_RDI->begin_ - (long)in_RDI->arr_ >> 3 == in_RDI->allocSize_) {
      in_RDI->begin_ = in_RDI->arr_;
    }
  }
  return;
}

Assistant:

void pop_front() {
        if (empty()) {
            return;
        }
        ++begin_;
        --size_;
        if (begin_ - arr_ == allocSize_) {
            begin_ = arr_;
        }
    }